

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void parse(ch_compilation *comp,ch_precedence_level prec)

{
  ch_token *pcVar1;
  ch_token *next;
  char *pcVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  ch_token_kind cVar5;
  undefined4 uVar6;
  _Bool _Var7;
  
  pcVar1 = &comp->previous;
  next = &comp->current;
  cVar5 = (comp->current).kind;
  uVar6 = *(undefined4 *)&(comp->current).field_0x4;
  pcVar2 = (comp->current).lexeme.start;
  uVar3 = (comp->current).line;
  uVar4 = *(undefined4 *)&(comp->current).field_0x1c;
  (comp->previous).lexeme.size = (comp->current).lexeme.size;
  (comp->previous).line = uVar3;
  *(undefined4 *)&(comp->previous).field_0x1c = uVar4;
  (comp->previous).kind = cVar5;
  *(undefined4 *)&(comp->previous).field_0x4 = uVar6;
  (comp->previous).lexeme.start = pcVar2;
  do {
    _Var7 = ch_token_next(&comp->token_state,next);
  } while (!_Var7);
  if (rules[pcVar1->kind].prefix_parse != (ch_parse_func)0x0) {
    (*rules[pcVar1->kind].prefix_parse)(comp);
    while (prec <= rules[(comp->current).kind].prec) {
      cVar5 = next->kind;
      uVar6 = *(undefined4 *)&next->field_0x4;
      pcVar2 = (comp->current).lexeme.start;
      uVar3 = (comp->current).line;
      uVar4 = *(undefined4 *)&(comp->current).field_0x1c;
      (comp->previous).lexeme.size = (comp->current).lexeme.size;
      (comp->previous).line = uVar3;
      *(undefined4 *)&(comp->previous).field_0x1c = uVar4;
      pcVar1->kind = cVar5;
      *(undefined4 *)&pcVar1->field_0x4 = uVar6;
      (comp->previous).lexeme.start = pcVar2;
      do {
        _Var7 = ch_token_next(&comp->token_state,next);
      } while (!_Var7);
      (*rules[(comp->previous).kind].infix_parse)(comp);
    }
    return;
  }
  error(comp,"Expected expression");
  return;
}

Assistant:

void parse(ch_compilation *comp, ch_precedence_level prec) {
  advance(comp);
  ch_parse_func prefix = get_rule(comp->previous.kind)->prefix_parse;
  if (!prefix) {
    error(comp, "Expected expression");
    return;
  }

  prefix(comp);

  while (prec <= get_rule(comp->current.kind)->prec) {
    advance(comp);
    ch_parse_func infix = get_rule(comp->previous.kind)->infix_parse;
    infix(comp);
  }
}